

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_node_check_syntax(lys_node *node)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  int iVar2;
  lys_node *plVar3;
  lyxp_expr *exp;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  char *local_40;
  uint16_t local_32 [4];
  uint16_t exp_idx;
  
  LVar1 = node->nodetype;
  local_40 = (char *)0x0;
  bVar6 = 0;
  switch(LVar1) {
  case LYS_CONTAINER:
    plVar3 = node + 1;
    local_40 = node[1].dsc;
    bVar6 = node->padding[1];
    break;
  case LYS_CHOICE:
switchD_001706fb_caseD_2:
    plVar3 = (lys_node *)node->hash;
LAB_00170746:
    bVar6 = 0;
    local_40 = (char *)0x0;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_001706fb_caseD_3;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_001706fb_caseD_4:
    plVar3 = node + 1;
    local_40 = node[1].dsc;
    bVar6 = node->padding[3];
    break;
  default:
    if (LVar1 == LYS_LIST) {
      plVar3 = node + 1;
      local_40 = node[1].dsc;
      bVar6 = node->padding[0];
      break;
    }
    if (LVar1 == LYS_ANYXML) goto switchD_001706fb_caseD_4;
    if (LVar1 == LYS_CASE) goto switchD_001706fb_caseD_2;
    if (LVar1 == LYS_NOTIF) {
      local_40 = node[1].dsc;
    }
    else {
      if ((LVar1 != LYS_INPUT) && (LVar1 != LYS_OUTPUT)) {
        if (LVar1 == LYS_USES) goto switchD_001706fb_caseD_2;
        if (LVar1 != LYS_AUGMENT) {
          bVar6 = 0;
          if (LVar1 != LYS_ANYDATA) goto switchD_001706fb_caseD_3;
          goto switchD_001706fb_caseD_4;
        }
        plVar3 = (lys_node *)&node->next;
        goto LAB_00170746;
      }
      local_40 = node[1].name;
    }
    bVar6 = node->padding[1];
    goto switchD_001706fb_caseD_3;
  }
  if (plVar3->name == (char *)0x0) {
switchD_001706fb_caseD_3:
    for (lVar7 = 0; (ulong)bVar6 * 0x38 - lVar7 != 0; lVar7 = lVar7 + 0x38) {
      exp = lyxp_parse_expr(node->module->ctx,*(char **)(local_40 + lVar7));
      if (exp == (lyxp_expr *)0x0) {
        return -1;
      }
      local_32[0] = 0;
      iVar2 = reparse_or_expr(node->module->ctx,exp,local_32);
      if (iVar2 != 0) goto LAB_00170870;
      if (local_32[0] != exp->used) goto LAB_0017083b;
      lyxp_expr_free(exp);
    }
    iVar2 = 0;
  }
  else {
    exp = lyxp_parse_expr(node->module->ctx,*(char **)plVar3->name);
    if (exp == (lyxp_expr *)0x0) {
      return -1;
    }
    local_32[0] = 0;
    iVar2 = reparse_or_expr(node->module->ctx,exp,local_32);
    if (iVar2 == 0) {
      if (local_32[0] == exp->used) {
        lyxp_expr_free(exp);
        goto switchD_001706fb_caseD_3;
      }
LAB_0017083b:
      ctx = node->module->ctx;
      uVar5 = (ulong)local_32[0];
      pcVar4 = print_token(exp->tokens[uVar5]);
      ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,exp->expr + exp->expr_pos[uVar5]);
    }
LAB_00170870:
    iVar2 = -1;
    lyxp_expr_free(exp);
  }
  return iVar2;
}

Assistant:

int
lyxp_node_check_syntax(const struct lys_node *node)
{
    uint8_t must_size = 0;
    uint16_t exp_idx;
    uint32_t i;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    struct lyxp_expr *expr;

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    /* check "when" */
    if (when) {
        expr = lyxp_parse_expr(node->module->ctx, when->cond);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_or_expr(node->module->ctx, expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(node->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        expr = lyxp_parse_expr(node->module->ctx, must[i].expr);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_or_expr(node->module->ctx, expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(node->module->ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    return 0;
}